

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenDiskFile(DiskSourceTree *this,string *filename)

{
  int iVar1;
  int *piVar2;
  FileInputStream *this_00;
  stat sb;
  
  do {
    iVar1 = stat((filename->_M_dataplus)._M_p,(stat *)&sb);
    if (iVar1 == 0) {
      if ((sb.st_mode & 0xf000) == 0x4000) {
        std::__cxx11::string::assign((char *)&this->last_error_message_);
        return (ZeroCopyInputStream *)0x0;
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  do {
    iVar1 = open((filename->_M_dataplus)._M_p,0);
    if (-1 < iVar1) {
      this_00 = (FileInputStream *)operator_new(0x58);
      io::FileInputStream::FileInputStream(this_00,iVar1,-1);
      (this_00->copying_input_).close_on_delete_ = true;
      return &this_00->super_ZeroCopyInputStream;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenDiskFile(
    const std::string& filename) {
  struct stat sb;
  int ret = 0;
  do {
    ret = stat(filename.c_str(), &sb);
  } while (ret != 0 && errno == EINTR);
#if defined(_WIN32)
  if (ret == 0 && sb.st_mode & S_IFDIR) {
    last_error_message_ = "Input file is a directory.";
    return NULL;
  }
#else
  if (ret == 0 && S_ISDIR(sb.st_mode)) {
    last_error_message_ = "Input file is a directory.";
    return NULL;
  }
#endif
  int file_descriptor;
  do {
    file_descriptor = open(filename.c_str(), O_RDONLY);
  } while (file_descriptor < 0 && errno == EINTR);
  if (file_descriptor >= 0) {
    io::FileInputStream* result = new io::FileInputStream(file_descriptor);
    result->SetCloseOnDelete(true);
    return result;
  } else {
    return NULL;
  }
}